

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp0_helper.c
# Opt level: O0

void helper_mtc0_pagegrain_mips(CPUMIPSState *env,target_ulong_conflict arg1)

{
  target_ulong_conflict arg1_local;
  CPUMIPSState *env_local;
  
  env->CP0_PageGrain =
       arg1 & env->CP0_PageGrain_rw_bitmask |
       env->CP0_PageGrain & (env->CP0_PageGrain_rw_bitmask ^ 0xffffffffU);
  compute_hflags(env);
  restore_pamask(env);
  return;
}

Assistant:

void helper_mtc0_pagegrain(CPUMIPSState *env, target_ulong arg1)
{
    /* SmartMIPS not implemented */
    /* 1k pages not implemented */
    env->CP0_PageGrain = (arg1 & env->CP0_PageGrain_rw_bitmask) |
                         (env->CP0_PageGrain & ~env->CP0_PageGrain_rw_bitmask);
    compute_hflags(env);
    restore_pamask(env);
}